

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.h
# Opt level: O0

int __thiscall
connector::server<(connector::CONNECTOR_TYPE)0>::init
          (server<(connector::CONNECTOR_TYPE)0> *this,EVP_PKEY_CTX *ctx)

{
  uint16_t uVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  char *local_80;
  char *local_70;
  char *local_60;
  char *local_50;
  char *local_40;
  char *local_30;
  server<(connector::CONNECTOR_TYPE)0> *this_local;
  
  iVar2 = socket(2,1,0);
  this->_listen_socket = iVar2;
  if (this->_listen_socket == -1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"[CONNECTOR - ");
    pcVar4 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/cirquit[P]connector/tests/../library/server.h"
                     ,0x2f);
    if (pcVar4 == (char *)0x0) {
      local_30 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/cirquit[P]connector/tests/../library/server.h"
      ;
    }
    else {
      local_30 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/cirquit[P]connector/tests/../library/server.h"
                         ,0x2f);
      local_30 = local_30 + 1;
    }
    poVar3 = std::operator<<(poVar3,local_30);
    poVar3 = std::operator<<(poVar3,':');
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x3f);
    poVar3 = std::operator<<(poVar3,':');
    poVar3 = std::operator<<(poVar3,"init");
    poVar3 = std::operator<<(poVar3,"()]: ");
    std::operator<<(poVar3,"Error creating socket with -1\n");
    this_local._4_4_ = -1;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"[CONNECTOR - ");
    pcVar4 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/cirquit[P]connector/tests/../library/server.h"
                     ,0x2f);
    if (pcVar4 == (char *)0x0) {
      local_40 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/cirquit[P]connector/tests/../library/server.h"
      ;
    }
    else {
      local_40 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/cirquit[P]connector/tests/../library/server.h"
                         ,0x2f);
      local_40 = local_40 + 1;
    }
    poVar3 = std::operator<<(poVar3,local_40);
    poVar3 = std::operator<<(poVar3,':');
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x42);
    poVar3 = std::operator<<(poVar3,':');
    poVar3 = std::operator<<(poVar3,"init");
    poVar3 = std::operator<<(poVar3,"()]: ");
    std::operator<<(poVar3,"Created socket!\n");
    (this->_ourAddr).sin_family = 2;
    (this->_ourAddr).sin_addr.s_addr = 0;
    uVar1 = htons((uint16_t)this->_port);
    (this->_ourAddr).sin_port = uVar1;
    iVar2 = bind(this->_listen_socket,(sockaddr *)this,0x10);
    this->_bnd = iVar2;
    if (this->_bnd < 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"[CONNECTOR - ");
      pcVar4 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/cirquit[P]connector/tests/../library/server.h"
                       ,0x2f);
      if (pcVar4 == (char *)0x0) {
        local_50 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/cirquit[P]connector/tests/../library/server.h"
        ;
      }
      else {
        local_50 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/cirquit[P]connector/tests/../library/server.h"
                           ,0x2f);
        local_50 = local_50 + 1;
      }
      poVar3 = std::operator<<(poVar3,local_50);
      poVar3 = std::operator<<(poVar3,':');
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x4b);
      poVar3 = std::operator<<(poVar3,':');
      poVar3 = std::operator<<(poVar3,"init");
      poVar3 = std::operator<<(poVar3,"()]: ");
      poVar3 = std::operator<<(poVar3,"Error binding with error: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->_bnd);
      std::operator<<(poVar3,'\n');
      this_local._4_4_ = -1;
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,"[CONNECTOR - ");
      pcVar4 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/cirquit[P]connector/tests/../library/server.h"
                       ,0x2f);
      if (pcVar4 == (char *)0x0) {
        local_60 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/cirquit[P]connector/tests/../library/server.h"
        ;
      }
      else {
        local_60 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/cirquit[P]connector/tests/../library/server.h"
                           ,0x2f);
        local_60 = local_60 + 1;
      }
      poVar3 = std::operator<<(poVar3,local_60);
      poVar3 = std::operator<<(poVar3,':');
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x4e);
      poVar3 = std::operator<<(poVar3,':');
      poVar3 = std::operator<<(poVar3,"init");
      poVar3 = std::operator<<(poVar3,"()]: ");
      poVar3 = std::operator<<(poVar3,"Binding successful to port ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->_port);
      std::operator<<(poVar3,"!\n");
      listen(this->_listen_socket,1);
      this->_len = 0x10;
      iVar2 = accept(this->_listen_socket,(sockaddr *)&this->_cliAddr,&this->_len);
      this->_skt = iVar2;
      if (this->_skt < 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"[CONNECTOR - ");
        pcVar4 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/cirquit[P]connector/tests/../library/server.h"
                         ,0x2f);
        if (pcVar4 == (char *)0x0) {
          local_70 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/cirquit[P]connector/tests/../library/server.h"
          ;
        }
        else {
          local_70 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/cirquit[P]connector/tests/../library/server.h"
                             ,0x2f);
          local_70 = local_70 + 1;
        }
        poVar3 = std::operator<<(poVar3,local_70);
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x56);
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = std::operator<<(poVar3,"init");
        poVar3 = std::operator<<(poVar3,"()]: ");
        poVar3 = std::operator<<(poVar3,"Connection accept failed with error: ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->_skt);
        std::operator<<(poVar3,'\n');
        this_local._4_4_ = -1;
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cerr,"[CONNECTOR - ");
        pcVar4 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/cirquit[P]connector/tests/../library/server.h"
                         ,0x2f);
        if (pcVar4 == (char *)0x0) {
          local_80 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/cirquit[P]connector/tests/../library/server.h"
          ;
        }
        else {
          local_80 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/cirquit[P]connector/tests/../library/server.h"
                             ,0x2f);
          local_80 = local_80 + 1;
        }
        poVar3 = std::operator<<(poVar3,local_80);
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x5b);
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = std::operator<<(poVar3,"init");
        poVar3 = std::operator<<(poVar3,"()]: ");
        poVar3 = std::operator<<(poVar3,"All clients (");
        poVar3 = std::operator<<(poVar3,"1");
        std::operator<<(poVar3,") connected!\n");
        this_local._4_4_ = this->_skt;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int init( ) {
        // creating socket
        _listen_socket = socket( AF_INET, SOCK_STREAM, 0 );
        if ( _listen_socket == -1 ) {
            DEBUG_CRIT_MSG_CONNECTOR( "Error creating socket with -1\n" );
            return -1;
        } else {
            DEBUG_MSG_CONNECTOR( "Created socket!\n" );
        }

        // binding port
        _ourAddr.sin_family      = AF_INET;
        _ourAddr.sin_addr.s_addr = INADDR_ANY;
        _ourAddr.sin_port        = htons( _port );
        _bnd = bind( _listen_socket, (struct sockaddr *)&_ourAddr, sizeof( _ourAddr ) );
        if ( _bnd < 0 ) {
            DEBUG_CRIT_MSG_CONNECTOR( "Error binding with error: " << _bnd << '\n' );
            return -1;
        } else {
            DEBUG_MSG_CONNECTOR( "Binding successful to port " << _port << "!\n" );
        }

        // waiting for _skt clients to connect (blocking)
        listen( _listen_socket, 1 );
        _len = sizeof( struct sockaddr_in );
        _skt = accept( _listen_socket, (struct sockaddr *)&_cliAddr, (socklen_t *)&_len );
        if ( _skt < 0 ) {
            DEBUG_CRIT_MSG_CONNECTOR( "Connection accept failed with error: " << _skt << '\n');
            return -1;
        } else {
            DEBUG_MSG_CONNECTOR( "All clients ("
                                << "1"
                                << ") connected!\n" );
        }
        return _skt;
    }